

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExecProgramCommand.cxx
# Opt level: O2

bool cmExecProgramCommand::RunCommand
               (char *command,string *output,int *retVal,char *dir,bool verbose)

{
  bool bVar1;
  char *s;
  uint uVar2;
  int iVar3;
  cmsysProcess *cp;
  int length;
  char *data;
  string commandInDir;
  string msg;
  char *cmd [4];
  int local_ac;
  int *local_a8;
  char *local_a0;
  char *local_98;
  undefined8 local_90;
  char local_88 [16];
  undefined1 *local_78;
  long local_70;
  undefined1 local_68 [16];
  char *local_58;
  char *local_50;
  char *local_48;
  undefined8 local_40;
  
  bVar1 = cmSystemTools::s_DisableRunCommandOutput;
  local_a8 = retVal;
  cp = cmsysProcess_New();
  if (cp == (cmsysProcess *)0x0) {
    cmSystemTools::Error("Error allocating process instance.",(char *)0x0,(char *)0x0,(char *)0x0);
    goto LAB_002acbee;
  }
  local_98 = local_88;
  local_90 = 0;
  local_88[0] = '\0';
  if (dir == (char *)0x0) {
    std::__cxx11::string::assign((char *)&local_98);
  }
  else {
    std::__cxx11::string::assign((char *)&local_98);
    std::__cxx11::string::append((char *)&local_98);
    std::__cxx11::string::append((char *)&local_98);
    std::__cxx11::string::append((char *)&local_98);
  }
  std::__cxx11::string::append((char *)&local_98);
  s = local_98;
  if ((~bVar1 & verbose) != 0) {
    cmSystemTools::Stdout("running ");
    cmSystemTools::Stdout(s);
    cmSystemTools::Stdout("\n");
  }
  fflush(_stdout);
  fflush(_stderr);
  local_58 = "/bin/sh";
  local_50 = "-c";
  local_48 = s;
  local_40 = 0;
  cmsysProcess_SetCommand(cp,&local_58);
  cmsysProcess_Execute(cp);
  while (uVar2 = cmsysProcess_WaitForData(cp,&local_a0,&local_ac,(double *)0x0), uVar2 != 0) {
    if ((uVar2 & 0xfffffffe) == 2) {
      if ((~bVar1 & verbose) != 0) {
        cmSystemTools::Stdout(local_a0,(long)local_ac);
      }
      std::__cxx11::string::append((char *)output,(ulong)local_a0);
    }
  }
  cmsysProcess_WaitForExit(cp,(double *)0x0);
  local_78 = local_68;
  local_70 = 0;
  local_68[0] = 0;
  iVar3 = cmsysProcess_GetState(cp);
  switch(iVar3) {
  case 1:
    *local_a8 = -1;
    std::__cxx11::string::append((char *)&local_78);
    cmsysProcess_GetErrorString(cp);
    goto LAB_002acb95;
  case 2:
    *local_a8 = -1;
    std::__cxx11::string::append((char *)&local_78);
    cmsysProcess_GetExceptionString(cp);
LAB_002acb95:
    std::__cxx11::string::append((char *)&local_78);
    break;
  case 4:
    iVar3 = cmsysProcess_GetExitValue(cp);
    *local_a8 = iVar3;
    break;
  case 5:
    *local_a8 = -1;
    std::__cxx11::string::append((char *)&local_78);
  }
  if (local_70 != 0) {
    std::__cxx11::string::append((string *)output);
  }
  cmsysProcess_Delete(cp);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
LAB_002acbee:
  return cp != (cmsysProcess *)0x0;
}

Assistant:

bool cmExecProgramCommand::RunCommand(const char* command,
                                      std::string& output,
                                      int &retVal,
                                      const char* dir,
                                      bool verbose)
{
  if(cmSystemTools::GetRunCommandOutput())
    {
    verbose = false;
    }

#if defined(_WIN32) && !defined(__CYGWIN__)
  // if the command does not start with a quote, then
  // try to find the program, and if the program can not be
  // found use system to run the command as it must be a built in
  // shell command like echo or dir
  int count = 0;
  std::string shortCmd;
  if(command[0] == '\"')
    {
    // count the number of quotes
    for(const char* s = command; *s != 0; ++s)
      {
      if(*s == '\"')
        {
        count++;
        if(count > 2)
          {
          break;
          }
        }
      }
    // if there are more than two double quotes use
    // GetShortPathName, the cmd.exe program in windows which
    // is used by system fails to execute if there are more than
    // one set of quotes in the arguments
    if(count > 2)
      {
      cmsys::RegularExpression quoted("^\"([^\"]*)\"[ \t](.*)");
      if(quoted.find(command))
        {
        std::string cmd = quoted.match(1);
        std::string args = quoted.match(2);
        if(! cmSystemTools::FileExists(cmd.c_str()) )
          {
          shortCmd = cmd;
          }
        else if(!cmSystemTools::GetShortPath(cmd.c_str(), shortCmd))
          {
         cmSystemTools::Error("GetShortPath failed for " , cmd.c_str());
          return false;
          }
        shortCmd += " ";
        shortCmd += args;

        command = shortCmd.c_str();
        }
      else
        {
        cmSystemTools::Error("Could not parse command line with quotes ",
                             command);
        }
      }
    }
#endif

  // Allocate a process instance.
  cmsysProcess* cp = cmsysProcess_New();
  if(!cp)
    {
    cmSystemTools::Error("Error allocating process instance.");
    return false;
    }

#if defined(_WIN32) && !defined(__CYGWIN__)
  if(dir)
    {
    cmsysProcess_SetWorkingDirectory(cp, dir);
    }
  if(cmSystemTools::GetRunCommandHideConsole())
    {
    cmsysProcess_SetOption(cp, cmsysProcess_Option_HideWindow, 1);
    }
  cmsysProcess_SetOption(cp, cmsysProcess_Option_Verbatim, 1);
  const char* cmd[] = {command, 0};
  cmsysProcess_SetCommand(cp, cmd);
#else
  std::string commandInDir;
  if(dir)
    {
    commandInDir = "cd \"";
    commandInDir += dir;
    commandInDir += "\" && ";
    commandInDir += command;
    }
  else
    {
    commandInDir = command;
    }
#ifndef __VMS
  commandInDir += " 2>&1";
#endif
  command = commandInDir.c_str();
  if(verbose)
    {
    cmSystemTools::Stdout("running ");
    cmSystemTools::Stdout(command);
    cmSystemTools::Stdout("\n");
    }
  fflush(stdout);
  fflush(stderr);
  const char* cmd[] = {"/bin/sh", "-c", command, 0};
  cmsysProcess_SetCommand(cp, cmd);
#endif

  cmsysProcess_Execute(cp);

  // Read the process output.
  int length;
  char* data;
  int p;
  while((p = cmsysProcess_WaitForData(cp, &data, &length, 0), p))
    {
    if(p == cmsysProcess_Pipe_STDOUT || p == cmsysProcess_Pipe_STDERR)
      {
      if(verbose)
        {
        cmSystemTools::Stdout(data, length);
        }
      output.append(data, length);
      }
    }

  // All output has been read.  Wait for the process to exit.
  cmsysProcess_WaitForExit(cp, 0);

  // Check the result of running the process.
  std::string msg;
  switch(cmsysProcess_GetState(cp))
    {
    case cmsysProcess_State_Exited:
      retVal = cmsysProcess_GetExitValue(cp);
      break;
    case cmsysProcess_State_Exception:
      retVal = -1;
      msg += "\nProcess terminated due to: ";
      msg += cmsysProcess_GetExceptionString(cp);
      break;
    case cmsysProcess_State_Error:
      retVal = -1;
      msg += "\nProcess failed because: ";
      msg += cmsysProcess_GetErrorString(cp);
      break;
    case cmsysProcess_State_Expired:
      retVal = -1;
      msg += "\nProcess terminated due to timeout.";
      break;
    }
  if(!msg.empty())
    {
#if defined(_WIN32) && !defined(__CYGWIN__)
    // Old Windows process execution printed this info.
    msg += "\n\nfor command: ";
    msg += command;
    if(dir)
      {
      msg += "\nin dir: ";
      msg += dir;
      }
    msg += "\n";
    if(verbose)
      {
      cmSystemTools::Stdout(msg.c_str());
      }
    output += msg;
#else
    // Old UNIX process execution only put message in output.
    output += msg;
#endif
    }

  // Delete the process instance.
  cmsysProcess_Delete(cp);

  return true;
}